

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_destroy_editor(_glist *x)

{
  _rtext *x_00;
  _rtext *rtext;
  _glist *x_local;
  
  glist_noselect(x);
  if (x->gl_editor != (t_editor *)0x0) {
    if (x->gl_editor->e_textedfor != (_rtext *)0x0) {
      rtext_activate(x->gl_editor->e_textedfor,0);
    }
    while (x_00 = x->gl_editor->e_rtext, x_00 != (_rtext *)0x0) {
      rtext_free(x_00);
    }
    editor_free(x->gl_editor,x);
    x->gl_editor = (t_editor *)0x0;
  }
  return;
}

Assistant:

void canvas_destroy_editor(t_glist *x)
{
    glist_noselect(x);
    if (x->gl_editor)
    {
        t_rtext *rtext;
            /* this happens if we had activated an atom box in run mode: */
        if (x->gl_editor->e_textedfor)
            rtext_activate(x->gl_editor->e_textedfor, 0);
        while ((rtext = x->gl_editor->e_rtext))
            rtext_free(rtext);
        editor_free(x->gl_editor, x);
        x->gl_editor = 0;
    }
}